

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O1

void __thiscall
CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex>::TestBody
          (CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex> *this)

{
  bool *pbVar1;
  DeathTest *pDVar2;
  DeathTest *pDVar3;
  bool bVar4;
  int iVar5;
  char *message;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  TrueWithString gtest_msg;
  TypeParam mtx;
  DeathTest *local_100;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_f8;
  undefined8 uStack_e0;
  AssertHelper local_d0 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b0;
  recursive_mutex_base local_98;
  
  yamc::checked::recursive_mutex::recursive_mutex((recursive_mutex *)&local_98);
  pbVar1 = &local_f8.impl_.full_match_;
  uStack_e0 = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.impl_.full_match_ = false;
  local_f8.impl_._17_7_ = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::recursive_mutex_base::lock(&local_98);
  }
  if (local_f8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_f8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  uStack_e0 = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.impl_.full_match_ = false;
  local_f8.impl_._17_7_ = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::recursive_mutex_base::lock(&local_98);
  }
  if (local_f8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_f8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  uStack_e0 = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.impl_.full_match_ = false;
  local_f8.impl_._17_7_ = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::recursive_mutex_base::unlock(&local_98);
  }
  if (local_f8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_f8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  uStack_e0 = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.impl_.full_match_ = false;
  local_f8.impl_._17_7_ = 0;
  local_f8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::recursive_mutex_base::unlock(&local_98);
  }
  if (local_f8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_f8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_d0[0].data_ = (AssertHelperData *)0x1cfcb9;
    testing::ContainsRegex<char_const*>(&local_f8,(testing *)local_d0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b0,(PolymorphicMatcher *)&local_f8);
    if (local_f8.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("mtx.unlock()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xc1,&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b0);
    pDVar2 = local_100;
    iVar5 = 6;
    if (bVar4) {
      if (local_100 != (DeathTest *)0x0) {
        iVar5 = (*local_100->_vptr_DeathTest[2])(local_100);
        pDVar3 = local_100;
        if (iVar5 == 0) {
          testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_f8,6);
          iVar5 = (*local_100->_vptr_DeathTest[3])();
          bVar4 = testing::KilledBySignal::operator()((KilledBySignal *)&local_f8,iVar5);
          iVar5 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar5 != '\0') goto LAB_001828ff;
          iVar5 = 6;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              yamc::checked::detail::recursive_mutex_base::unlock(&local_98);
            }
            (*local_100->_vptr_DeathTest[5])(local_100,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_001828ff:
          iVar5 = 0;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_00182912;
      }
      iVar5 = 0;
    }
LAB_00182912:
    if (iVar5 != 6) goto LAB_0018296d;
  }
  testing::Message::Message((Message *)&local_f8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0xc1,message);
  testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_f8);
  testing::internal::AssertHelper::~AssertHelper(local_d0);
  if (local_f8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (**(code **)((local_f8.impl_.regex_.
                  super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->pattern_ + 8))();
  }
LAB_0018296d:
  yamc::checked::recursive_mutex::~recursive_mutex((recursive_mutex *)&local_98);
  return;
}

Assistant:

TYPED_TEST(CheckedRecursiveMutexTest, InvalidUnlock2) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());    // lockcnt = 1
  ASSERT_NO_THROW(mtx.lock());    // lockcnt = 2
  ASSERT_NO_THROW(mtx.unlock());  // lockcnt = 1
  ASSERT_NO_THROW(mtx.unlock());  // lockcnt = 0
  EXPECT_CHECK_FAILURE(mtx.unlock());
}